

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

__pid_t __thiscall QThread::wait(QThread *this,void *__stat_loc)

{
  bool bVar1;
  __pid_t _Var2;
  QThreadPrivate *this_00;
  long in_FS_OFFSET;
  QThreadPrivate *d;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  byte local_59;
  QMessageLogger local_48;
  void *local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = __stat_loc;
  this_00 = d_func((QThread *)0x5578d0);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  if ((this_00->threadState == NotStarted) || (this_00->threadState == Finished)) {
    local_59 = 1;
  }
  else {
    bVar1 = isCurrentThread((QThread *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                           );
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 in_stack_ffffffffffffff64,(char *)in_stack_ffffffffffffff58);
      QMessageLogger::warning(&local_48,"QThread::wait: Thread tried to wait on itself");
      local_59 = 0;
    }
    else {
      _Var2 = QThreadPrivate::wait(this_00,&local_18);
      local_59 = (byte)_Var2 & 1;
    }
  }
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__pid_t)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_59);
  }
  __stack_chk_fail();
}

Assistant:

bool QThread::wait(QDeadlineTimer deadline)
{
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);

    if (d->threadState == QThreadPrivate::NotStarted || d->threadState == QThreadPrivate::Finished)
        return true;
    if (isCurrentThread()) {
        qWarning("QThread::wait: Thread tried to wait on itself");
        return false;
    }
    return d->wait(locker, deadline);
}